

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbitblb.cpp
# Opt level: O1

void __thiscall icu_63::RBBITableBuilder::~RBBITableBuilder(RBBITableBuilder *this)

{
  RBBIStateDescriptor *this_00;
  uint index;
  void *p;
  UVector *this_01;
  
  this_01 = this->fDStates;
  if (0 < this_01->count) {
    index = 0;
    do {
      p = (void *)(ulong)index;
      this_00 = (RBBIStateDescriptor *)UVector::elementAt(this_01,index);
      if (this_00 != (RBBIStateDescriptor *)0x0) {
        RBBIStateDescriptor::~RBBIStateDescriptor(this_00);
        UMemory::operator_delete((UMemory *)this_00,p);
      }
      index = index + 1;
      this_01 = this->fDStates;
    } while ((int)index < this_01->count);
  }
  if (this_01 != (UVector *)0x0) {
    (*(this_01->super_UObject)._vptr_UObject[1])();
  }
  if (this->fSafeTable != (UVector *)0x0) {
    (*(this->fSafeTable->super_UObject)._vptr_UObject[1])();
    return;
  }
  return;
}

Assistant:

RBBITableBuilder::~RBBITableBuilder() {
    int i;
    for (i=0; i<fDStates->size(); i++) {
        delete (RBBIStateDescriptor *)fDStates->elementAt(i);
    }
    delete fDStates;
    delete fSafeTable;
}